

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_EvalObject(JSContext *ctx,JSValue this_obj,JSValue val,int flags,int scope_idx)

{
  char *ptr;
  ulong uVar1;
  JSRefCountHeader *p;
  JSValue JVar2;
  size_t len;
  
  if ((uint)val.tag == 0xfffffff9) {
    uVar1 = 0;
    ptr = JS_ToCStringLen2(ctx,&len,val,0);
    if (ptr == (char *)0x0) {
      val = (JSValue)(ZEXT816(6) << 0x40);
      goto LAB_00136fa0;
    }
    if (ctx->eval_internal ==
        (_func_JSValue_JSContext_ptr_JSValue_char_ptr_size_t_char_ptr_int_int *)0x0) {
      JS_ThrowTypeError(ctx,"eval is not supported");
      val = (JSValue)(ZEXT816(6) << 0x40);
    }
    else {
      val = (*ctx->eval_internal)(ctx,this_obj,ptr,len,"<input>",flags,scope_idx);
    }
    JS_FreeCString(ctx,ptr);
  }
  else if (0xfffffff4 < (uint)val.tag) {
    *(int *)val.u.ptr = *val.u.ptr + 1;
  }
  uVar1 = (ulong)val.u.ptr & 0xffffffff00000000;
LAB_00136fa0:
  JVar2.u.ptr = (void *)((ulong)val.u.ptr & 0xffffffff | uVar1);
  JVar2.tag = val.tag;
  return JVar2;
}

Assistant:

static JSValue JS_EvalObject(JSContext *ctx, JSValueConst this_obj,
                             JSValueConst val, int flags, int scope_idx)
{
    JSValue ret;
    const char *str;
    size_t len;

    if (!JS_IsString(val))
        return JS_DupValue(ctx, val);
    str = JS_ToCStringLen(ctx, &len, val);
    if (!str)
        return JS_EXCEPTION;
    ret = JS_EvalInternal(ctx, this_obj, str, len, "<input>", flags, scope_idx);
    JS_FreeCString(ctx, str);
    return ret;

}